

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O1

bool __thiscall Extensions::Decode(Extensions *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  size_t local_28;
  size_t cbSize;
  size_t cbPrefix;
  
  local_28 = 0;
  cbSize = 0;
  bVar1 = DerBase::DecodeSetOrSequenceOf<Extension>
                    (ConstructedSequence,pIn,cbIn,&cbSize,&local_28,&this->values);
  if (bVar1) {
    (this->super_DerBase).cbData = local_28;
    *cbUsed = local_28 + cbSize;
  }
  return bVar1;
}

Assistant:

virtual bool Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed) override
	{
		// This is actually a SEQUENCE, oddly, seems it should be a set
		// Extensions  ::=  SEQUENCE SIZE (1..MAX) OF Extension
		size_t cbSize = 0;
		size_t cbPrefix = 0;
		bool ret = DecodeSequenceOf(pIn, cbIn, cbPrefix, cbSize, values);

		if (ret)
		{
			cbData = cbSize;
			cbUsed = cbSize + cbPrefix;
		}

		return ret;
	}